

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

void Dau_DsdGenRandPerm(int *pPerm,int nVars)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if (0 < nVars) {
    uVar4 = (ulong)(uint)nVars;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pPerm[uVar3] = (int)uVar3;
  }
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    iVar2 = rand();
    iVar1 = pPerm[uVar3];
    pPerm[uVar3] = pPerm[iVar2 % nVars];
    pPerm[iVar2 % nVars] = iVar1;
  }
  return;
}

Assistant:

void Dau_DsdGenRandPerm( int * pPerm, int nVars )
{
    int v, vNew;
    for ( v = 0; v < nVars; v++ )
        pPerm[v] = v;
    for ( v = 0; v < nVars; v++ )
    {
        vNew = rand() % nVars;
        ABC_SWAP( int, pPerm[v], pPerm[vNew] );
    }
}